

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_common.c
# Opt level: O0

size_t nhr_request_map_strings_length(_nhr_map_node *map,size_t iteration_increment)

{
  size_t sVar1;
  size_t sVar2;
  _nhr_map_node *local_28;
  _nhr_map_node *cur;
  size_t len;
  size_t iteration_increment_local;
  _nhr_map_node *map_local;
  
  cur = (_nhr_map_node *)0x0;
  for (local_28 = map; local_28 != (_nhr_map_node *)0x0; local_28 = local_28->next) {
    sVar1 = strlen(local_28->key);
    sVar2 = strlen((local_28->value).string);
    cur = (_nhr_map_node *)((long)&cur->key + sVar1 + sVar2 + iteration_increment);
  }
  return (size_t)cur;
}

Assistant:

size_t nhr_request_map_strings_length(_nhr_map_node * map, const size_t iteration_increment) {
	size_t len = 0;
	_nhr_map_node *cur = map;
	while (cur) {
		len += strlen(cur->key) + strlen(cur->value.string) + iteration_increment;
		cur = cur->next;
	}
	return len;
}